

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::IRContext::ProcessCallTreeFromRoots
          (IRContext *this,ProcessFunction *pfn,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *roots)

{
  bool bVar1;
  _Elt_pointer puVar2;
  Function *func;
  bool bVar3;
  IRContext *this_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar4;
  uint32_t fi;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  done;
  uint local_7c;
  Function *local_78;
  IRContext *local_70;
  undefined1 local_68 [40];
  _func_int **local_40;
  Instruction *pIStack_38;
  
  local_68._0_8_ = &pIStack_38;
  local_68._8_8_ = (pointer)0x1;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = (pointer)0x0;
  local_68._32_4_ = 1.0;
  local_40 = (_func_int **)0x0;
  pIStack_38 = (Instruction *)0x0;
  puVar2 = (roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_70 = this;
  if ((roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == puVar2) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    do {
      local_7c = *puVar2;
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front(&roots->c);
      local_78 = (Function *)local_68;
      pVar4 = std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_68,&local_7c,&local_78);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        func = GetFunction(local_70,local_7c);
        if (func == (Function *)0x0) {
          __assert_fail("fn && \"Trying to process a function that does not exist.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp"
                        ,0x3d8,
                        "bool spvtools::opt::IRContext::ProcessCallTreeFromRoots(ProcessFunction &, std::queue<uint32_t> *)"
                       );
        }
        local_78 = func;
        if ((pfn->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        this_00 = (IRContext *)pfn;
        bVar1 = (*pfn->_M_invoker)((_Any_data *)pfn,&local_78);
        if (bVar1) {
          bVar3 = true;
        }
        AddCalls(this_00,func,roots);
      }
      puVar2 = (roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    } while ((roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != puVar2);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  return bVar3;
}

Assistant:

bool IRContext::ProcessCallTreeFromRoots(ProcessFunction& pfn,
                                         std::queue<uint32_t>* roots) {
  // Process call tree
  bool modified = false;
  std::unordered_set<uint32_t> done;

  while (!roots->empty()) {
    const uint32_t fi = roots->front();
    roots->pop();
    if (done.insert(fi).second) {
      Function* fn = GetFunction(fi);
      assert(fn && "Trying to process a function that does not exist.");
      modified = pfn(fn) || modified;
      AddCalls(fn, roots);
    }
  }
  return modified;
}